

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_input(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  size_t *psVar1;
  ptls_buffer_t *buf;
  uint8_t uVar2;
  uint8_t uVar3;
  byte bVar4;
  st_ptls_early_data_receiver_t *psVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint extraout_EAX;
  size_t sVar24;
  size_t sVar25;
  uint8_t *puVar26;
  ushort uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ptls_buffer_t *buf_00;
  uint8_t *puVar31;
  bool bVar32;
  ptls_iovec_t message;
  st_ptls_record_t rec;
  size_t sStack_60;
  uint8_t *local_58;
  ptls_buffer_t *local_50;
  ptls_buffer_t *local_48;
  ptls_buffer_t *local_40;
  ptls_handshake_properties_t *local_38;
  
  buf_00 = &(tls->recvbuf).rec;
  puVar26 = (tls->recvbuf).rec.base;
  local_40 = sendbuf;
  local_38 = properties;
  if ((puVar26 == (uint8_t *)0x0) && ((uint8_t *)0x4 < (uint8_t *)*inlen)) {
    uVar2 = *input;
    uVar27 = *(ushort *)((long)input + 3) << 8 | *(ushort *)((long)input + 3) >> 8;
    sStack_60 = (size_t)uVar27;
    uVar28 = (ulong)(uVar2 == '\x17') << 8 | 0x4000;
    iVar21 = 0x32;
    if (sStack_60 <= uVar28) {
      iVar21 = 0;
    }
    if ((uint)uVar27 <= (uint)uVar28) {
      puVar31 = (uint8_t *)(sStack_60 + 5);
      if ((uint8_t *)*inlen < puVar31) goto LAB_00107add;
      local_58 = (uint8_t *)((long)input + 5);
      iVar21 = 0;
      goto LAB_00107c6d;
    }
  }
  else {
LAB_00107add:
    sVar25 = *inlen;
    uVar2 = '\0';
    sStack_60 = 0;
    local_58 = (uint8_t *)0x0;
    if (puVar26 == (uint8_t *)0x0) {
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      iVar21 = ptls_buffer_reserve(buf_00,5);
      if (iVar21 != 0) goto LAB_00107c71;
    }
    uVar28 = (tls->recvbuf).rec.off;
    sVar24 = sVar25;
    puVar31 = (uint8_t *)input;
    while (uVar28 < 5) {
      if (sVar24 == 0) {
        iVar21 = 0x202;
        goto LAB_00107c71;
      }
      uVar3 = *puVar31;
      puVar31 = puVar31 + 1;
      puVar26 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = uVar28 + 1;
      puVar26[uVar28] = uVar3;
      sVar24 = sVar24 - 1;
      uVar28 = (tls->recvbuf).rec.off;
    }
    puVar26 = (((anon_struct_64_2_7cec4369_for_recvbuf *)buf_00)->rec).base;
    uVar2 = *puVar26;
    uVar27 = *(ushort *)(puVar26 + 3);
    uVar27 = uVar27 << 8 | uVar27 >> 8;
    sStack_60 = (size_t)uVar27;
    uVar29 = (ulong)(uVar2 == '\x17') << 8 | 0x4000;
    iVar21 = 0x32;
    if (sStack_60 <= uVar29) {
      iVar21 = 0;
    }
    if ((uint)uVar27 <= (uint)uVar29) {
      lVar30 = (long)input + sVar25;
      uVar28 = (sStack_60 + 5) - uVar28;
      if (uVar28 != 0) {
        local_50 = decryptbuf;
        iVar21 = ptls_buffer_reserve(buf_00,uVar28);
        decryptbuf = local_50;
        if (iVar21 != 0) goto LAB_00107c71;
        uVar29 = lVar30 - (long)puVar31;
        if (uVar28 < uVar29) {
          uVar29 = uVar28;
        }
        local_48 = buf_00;
        if (uVar29 != 0) {
          memcpy((tls->recvbuf).rec.base + (tls->recvbuf).rec.off,puVar31,uVar29);
          psVar1 = &(tls->recvbuf).rec.off;
          *psVar1 = *psVar1 + uVar29;
          puVar31 = puVar31 + uVar29;
          decryptbuf = local_50;
          buf_00 = local_48;
        }
      }
      iVar21 = 0x202;
      if ((tls->recvbuf).rec.off == sStack_60 + 5) {
        local_58 = ((ptls_buffer_t *)&buf_00->base)->base + 5;
        iVar21 = 0;
      }
      puVar31 = puVar31 + (*inlen - lVar30);
LAB_00107c6d:
      *inlen = (size_t)puVar31;
    }
  }
LAB_00107c71:
  if (iVar21 != 0) {
    return iVar21;
  }
  if (local_58 == (uint8_t *)0x0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                  ,0x88e,
                  "int handle_input(ptls_t *, ptls_buffer_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
    if (uVar2 != '\x17') {
      return 0x28;
    }
    iVar21 = ptls_buffer_reserve(decryptbuf,sStack_60 + 5);
    if (iVar21 != 0) {
      return iVar21;
    }
    iVar21 = ptls_aead_transform((tls->traffic_protection).dec.aead,
                                 decryptbuf->base + decryptbuf->off,&sStack_60,local_58,sStack_60,
                                 '\0');
    bVar4 = *(byte *)&(tls->field_7).server;
    if (iVar21 != 0) {
      uVar22 = 0x202;
      if ((bVar4 & 2) == 0) {
        return iVar21;
      }
      goto LAB_00107fc1;
    }
    *(byte *)&(tls->field_7).server = bVar4 & 0xfd;
    local_58 = decryptbuf->base + decryptbuf->off;
    bVar32 = sStack_60 == 0;
    if (bVar32) {
      return 10;
    }
    if (local_58[sStack_60 - 1] == '\0') {
      sVar25 = sStack_60;
      do {
        sStack_60 = sVar25 - 1;
        bVar32 = sVar25 == 1;
        if (bVar32) {
          return 10;
        }
        lVar30 = sVar25 + (decryptbuf->off - 2);
        sVar25 = sStack_60;
      } while (decryptbuf->base[lVar30] == '\0');
    }
    if (bVar32) {
      return 10;
    }
    uVar2 = local_58[sStack_60 - 1];
    sStack_60 = sStack_60 - 1;
  }
  puVar26 = (tls->recvbuf).mess.base;
  if (uVar2 != '\x16' && puVar26 == (uint8_t *)0x0) {
    if (uVar2 == '\x15') {
      uVar22 = 0x32;
      if (sStack_60 == 2) {
        bVar4 = local_58[1];
        if (*local_58 == '\x01') {
          uVar22 = 0;
          if (bVar4 == 0x5a) goto LAB_00107fc1;
          if (bVar4 == 1) {
            psVar5 = (tls->field_7).server.early_data;
            if (psVar5 != (st_ptls_early_data_receiver_t *)0x0) {
              uVar6 = *(undefined4 *)psVar5->next_secret;
              uVar7 = *(undefined4 *)(psVar5->next_secret + 4);
              uVar8 = *(undefined4 *)(psVar5->next_secret + 8);
              uVar9 = *(undefined4 *)(psVar5->next_secret + 0xc);
              uVar10 = *(undefined4 *)(psVar5->next_secret + 0x10);
              uVar11 = *(undefined4 *)(psVar5->next_secret + 0x14);
              uVar12 = *(undefined4 *)(psVar5->next_secret + 0x18);
              uVar13 = *(undefined4 *)(psVar5->next_secret + 0x1c);
              uVar14 = *(undefined4 *)(psVar5->next_secret + 0x20);
              uVar15 = *(undefined4 *)(psVar5->next_secret + 0x24);
              uVar16 = *(undefined4 *)(psVar5->next_secret + 0x28);
              uVar17 = *(undefined4 *)(psVar5->next_secret + 0x2c);
              uVar18 = *(undefined4 *)(psVar5->next_secret + 0x34);
              uVar19 = *(undefined4 *)(psVar5->next_secret + 0x38);
              uVar20 = *(undefined4 *)(psVar5->next_secret + 0x3c);
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x30) =
                   *(undefined4 *)(psVar5->next_secret + 0x30);
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x34) = uVar18;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x38) = uVar19;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x3c) = uVar20;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x20) = uVar14;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x24) = uVar15;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x28) = uVar16;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x2c) = uVar17;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x10) = uVar10;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x14) = uVar11;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x18) = uVar12;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x1c) = uVar13;
              *(undefined4 *)(tls->traffic_protection).dec.secret = uVar6;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 4) = uVar7;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 8) = uVar8;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0xc) = uVar9;
              (*ptls_clear_memory)(psVar5,0x40);
              free((tls->field_7).server.early_data);
              (tls->field_7).server.early_data = (st_ptls_early_data_receiver_t *)0x0;
              uVar22 = setup_traffic_protection(tls,tls->cipher_suite,0,(char *)0x0);
            }
            goto LAB_00107fc1;
          }
        }
        uVar22 = bVar4 | 0x100;
      }
    }
    else {
      uVar22 = 10;
      if (uVar2 == '\x17') {
        if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
          if ((tls->state == PTLS_STATE_SERVER_EXPECT_FINISHED) &&
             (uVar22 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
            decryptbuf->off = decryptbuf->off + sStack_60;
          }
        }
        else {
          decryptbuf->off = decryptbuf->off + sStack_60;
          uVar22 = 0;
        }
      }
    }
    goto LAB_00107fc1;
  }
  if (uVar2 == '\x16') {
    buf = &(tls->recvbuf).mess;
    if ((puVar26 == (uint8_t *)0x0) && (3 < sStack_60)) {
      uVar28 = (ulong)local_58[3] | (ulong)((uint)local_58[2] << 8 | (uint)local_58[1] << 0x10);
      uVar22 = 0;
      sVar25 = sStack_60;
      puVar26 = local_58;
      if (sStack_60 - 4 != uVar28) goto LAB_00107dec;
    }
    else {
LAB_00107dec:
      uVar22 = ptls_buffer_reserve(buf,sStack_60);
      if (uVar22 != 0) {
        bVar32 = false;
        uVar23 = uVar22;
        goto LAB_00107f94;
      }
      memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,local_58,sStack_60);
      uVar28 = (tls->recvbuf).mess.off + sStack_60;
      puVar31 = (tls->recvbuf).mess.base;
      (tls->recvbuf).mess.off = uVar28;
      uVar22 = 0x202;
      if (3 < uVar28) {
        uVar29 = (ulong)puVar31[3] | (ulong)((uint)puVar31[2] << 8 | (uint)puVar31[1] << 0x10);
        if ((uVar29 <= uVar28 - 4) && (uVar22 = 0x32, uVar28 - 4 <= uVar29)) {
          uVar22 = 0;
        }
      }
      sVar25 = 0;
      puVar26 = (uint8_t *)0x0;
      if (uVar22 == 0) {
        uVar22 = 0;
        sVar25 = uVar28;
        puVar26 = puVar31;
      }
    }
    uVar23 = (uint)uVar28;
    bVar32 = true;
    if (puVar26 != (uint8_t *)0x0) {
      message.len = sVar25;
      message.base = puVar26;
      uVar22 = handle_handshake_message(tls,local_40,message,local_38);
      ptls_buffer__release_memory(buf);
      (tls->recvbuf).mess.off = 0;
      *(undefined8 *)&(tls->recvbuf).mess.is_allocated = 0;
      buf->base = (uint8_t *)0x0;
      (tls->recvbuf).mess.capacity = 0;
      uVar23 = extraout_EAX;
    }
  }
  else {
    uVar23 = 0x32;
    bVar32 = false;
    uVar22 = 0;
  }
LAB_00107f94:
  if (!bVar32) {
    return uVar23;
  }
LAB_00107fc1:
  ptls_buffer__release_memory(buf_00);
  buf_00->off = 0;
  *(undefined8 *)&buf_00->is_allocated = 0;
  buf_00->base = (uint8_t *)0x0;
  buf_00->capacity = 0;
  return uVar22;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (tls->traffic_protection.dec.aead != NULL) {
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = ptls_aead_transform(tls->traffic_protection.dec.aead, decryptbuf->base + decryptbuf->off, &rec.length,
                                       rec.fragment, rec.length, 0)) != 0) {
            if (tls->server.skip_early_data) {
                ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
                goto NextRecord;
            }
            return ret;
        }
        tls->server.skip_early_data = 0;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {

        /* handshake */
        ptls_iovec_t message = {NULL};
        if (rec.type != PTLS_CONTENT_TYPE_HANDSHAKE)
            return PTLS_ALERT_DECODE_ERROR;

        /* handle the record directly, or buffer the message split into multiple records */
        if (tls->recvbuf.mess.base == NULL && test_handshake_message(rec.fragment, rec.length) == 0) {
            message = ptls_iovec_init(rec.fragment, rec.length);
        } else {
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec.length)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec.fragment, rec.length);
            tls->recvbuf.mess.off += rec.length;
            if ((ret = test_handshake_message(tls->recvbuf.mess.base, tls->recvbuf.mess.off)) == 0)
                message = ptls_iovec_init(tls->recvbuf.mess.base, tls->recvbuf.mess.off);
        }

        /* handle the complete message, if available */
        if (message.base != NULL) {
            ret = handle_handshake_message(tls, sendbuf, message, properties);
            ptls_buffer_dispose(&tls->recvbuf.mess);
        }

    } else {

        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_FINISHED) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;
}